

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::QuantileContFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  element_type *other;
  LogicalType local_630;
  AggregateFunctionSet *local_618;
  vector<duckdb::AggregateFunction,_true> *local_610;
  LogicalType local_608;
  element_type *local_5f0;
  LogicalType local_5e8;
  LogicalType local_5d0;
  LogicalType local_5b8;
  LogicalType local_5a0;
  LogicalType local_588;
  LogicalType local_570;
  LogicalType local_558;
  string local_540;
  LogicalType local_520;
  LogicalType local_508;
  AggregateFunction local_4f0;
  AggregateFunction local_3c0;
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  ::std::__cxx11::string::string((string *)&local_540,"quantile_cont",(allocator *)&local_630);
  local_618 = in_RDI;
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_540);
  ::std::__cxx11::string::~string((string *)&local_540);
  LogicalType::LogicalType(&local_558,DECIMAL);
  LogicalType::LogicalType(&local_570,DECIMAL);
  LogicalType::LogicalType(&local_630,DOUBLE);
  EmptyQuantileFunction<duckdb::ContinuousQuantileFunction>
            (&local_3c0,&local_558,&local_570,&local_630);
  local_610 = &(local_618->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&local_610->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_3c0);
  AggregateFunction::~AggregateFunction(&local_3c0);
  LogicalType::~LogicalType(&local_630);
  LogicalType::~LogicalType(&local_570);
  LogicalType::~LogicalType(&local_558);
  LogicalType::LogicalType(&local_588,DECIMAL);
  LogicalType::LogicalType(&local_5a0,DECIMAL);
  LogicalType::LogicalType(&local_608,DOUBLE);
  LogicalType::LIST(&local_630,&local_608);
  EmptyQuantileFunction<duckdb::ContinuousQuantileListFunction>
            (&local_4f0,&local_588,&local_5a0,&local_630);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&local_610->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_4f0);
  AggregateFunction::~AggregateFunction(&local_4f0);
  LogicalType::~LogicalType(&local_630);
  LogicalType::~LogicalType(&local_608);
  LogicalType::~LogicalType(&local_5a0);
  LogicalType::~LogicalType(&local_588);
  GetContinuousQuantileTypes();
  local_5f0 = local_630.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (other = (element_type *)local_630._0_8_; other != local_5f0;
      other = (element_type *)&(other->alias)._M_string_length) {
    LogicalType::LogicalType(&local_5b8,(LogicalType *)other);
    LogicalType::LogicalType(&local_5d0,(LogicalType *)other);
    LogicalType::LogicalType(&local_608,DOUBLE);
    EmptyQuantileFunction<duckdb::ContinuousQuantileFunction>
              (&local_160,&local_5b8,&local_5d0,&local_608);
    ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>
              (&local_610->
                super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
               &local_160);
    AggregateFunction::~AggregateFunction(&local_160);
    LogicalType::~LogicalType(&local_608);
    LogicalType::~LogicalType(&local_5d0);
    LogicalType::~LogicalType(&local_5b8);
    LogicalType::LogicalType(&local_5e8,(LogicalType *)other);
    LogicalType::LogicalType(&local_508,(LogicalType *)other);
    LogicalType::LogicalType(&local_520,DOUBLE);
    LogicalType::LIST(&local_608,&local_520);
    EmptyQuantileFunction<duckdb::ContinuousQuantileListFunction>
              (&local_290,&local_5e8,&local_508,&local_608);
    ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>
              (&local_610->
                super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
               &local_290);
    AggregateFunction::~AggregateFunction(&local_290);
    LogicalType::~LogicalType(&local_608);
    LogicalType::~LogicalType(&local_520);
    LogicalType::~LogicalType(&local_508);
    LogicalType::~LogicalType(&local_5e8);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_630);
  return local_618;
}

Assistant:

AggregateFunctionSet QuantileContFun::GetFunctions() {
	AggregateFunctionSet quantile_cont("quantile_cont");
	quantile_cont.AddFunction(EmptyQuantileFunction<ContinuousQuantileFunction>(
	    LogicalTypeId::DECIMAL, LogicalTypeId::DECIMAL, LogicalType::DOUBLE));
	quantile_cont.AddFunction(EmptyQuantileFunction<ContinuousQuantileListFunction>(
	    LogicalTypeId::DECIMAL, LogicalTypeId::DECIMAL, LogicalType::LIST(LogicalType::DOUBLE)));
	for (const auto &type : GetContinuousQuantileTypes()) {
		quantile_cont.AddFunction(EmptyQuantileFunction<ContinuousQuantileFunction>(type, type, LogicalType::DOUBLE));
		quantile_cont.AddFunction(
		    EmptyQuantileFunction<ContinuousQuantileListFunction>(type, type, LogicalType::LIST(LogicalType::DOUBLE)));
	}
	return quantile_cont;
}